

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

int amqpvalue_get_composite_item_count(AMQP_VALUE value,uint32_t *item_count)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1cec;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1cec;
    }
    pcVar4 = "NULL value";
    iVar3 = 0x1ceb;
  }
  else if ((value->type & ~AMQP_TYPE_NULL) == AMQP_TYPE_DESCRIBED) {
    iVar1 = amqpvalue_get_list_item_count((value->value).described_value.value,item_count);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1cfc;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1cfc;
    }
    pcVar4 = "amqpvalue_get_list_item_in_place failed for composite item";
    iVar3 = 0x1cfb;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1cf5;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1cf5;
    }
    pcVar4 = "Attempt to get composite item in place on a non-composite type";
    iVar3 = 0x1cf4;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"amqpvalue_get_composite_item_count",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int amqpvalue_get_composite_item_count(AMQP_VALUE value, uint32_t* item_count)
{
    int result;

    if (value == NULL)
    {
        LogError("NULL value");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if ((value_data->type != AMQP_TYPE_COMPOSITE) &&
            (value_data->type != AMQP_TYPE_DESCRIBED))
        {
            LogError("Attempt to get composite item in place on a non-composite type");
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_get_list_item_count(value_data->value.described_value.value, item_count) != 0)
            {
                LogError("amqpvalue_get_list_item_in_place failed for composite item");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }

    return result;
}